

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O0

VkBufferView __thiscall
Diligent::ShaderResourceCacheVk::Resource::GetBufferViewWriteInfo(Resource *this)

{
  Char *pCVar1;
  IDeviceObject *pIVar2;
  BufferViewVkImpl *this_00;
  VkBufferView pVVar3;
  BufferViewVkImpl *pBuffViewVk;
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  Resource *this_local;
  
  msg.field_2._8_8_ = this;
  if (((this->Type != UniformTexelBuffer) && (this->Type != StorageTexelBuffer)) &&
     (this->Type != StorageTexelBuffer_ReadOnly)) {
    FormatString<char[47]>
              ((string *)local_30,(char (*) [47])"Uniform or storage buffer resource is expected");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"GetBufferViewWriteInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x32d);
    std::__cxx11::string::~string((string *)local_30);
  }
  pIVar2 = Diligent::RefCntAutoPtr::operator_cast_to_IDeviceObject_((RefCntAutoPtr *)&this->pObject)
  ;
  if (pIVar2 == (IDeviceObject *)0x0) {
    FormatString<char[60]>
              ((string *)&pBuffViewVk,
               (char (*) [60])"Unable to get buffer view write info: cached object is null");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"GetBufferViewWriteInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x32e);
    std::__cxx11::string::~string((string *)&pBuffViewVk);
  }
  this_00 = RefCntAutoPtr<Diligent::IDeviceObject>::ConstPtr<Diligent::BufferViewVkImpl>
                      (&this->pObject);
  pVVar3 = BufferViewVkImpl::GetVkBufferView(this_00);
  return pVVar3;
}

Assistant:

VkBufferView ShaderResourceCacheVk::Resource::GetBufferViewWriteInfo() const
{
    VERIFY((Type == DescriptorType::UniformTexelBuffer ||
            Type == DescriptorType::StorageTexelBuffer ||
            Type == DescriptorType::StorageTexelBuffer_ReadOnly),
           "Uniform or storage buffer resource is expected");
    DEV_CHECK_ERR(pObject != nullptr, "Unable to get buffer view write info: cached object is null");

    // The following bits must have been set at buffer creation time:
    //  * VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER  ->  VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT
    //  * VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER  ->  VK_BUFFER_USAGE_UNIFORM_TEXEL_BUFFER_BIT
    const BufferViewVkImpl* pBuffViewVk = pObject.ConstPtr<BufferViewVkImpl>();
    return pBuffViewVk->GetVkBufferView();
}